

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::mousePressEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar4;
  Representation RVar5;
  Representation RVar6;
  Representation RVar7;
  int iVar8;
  QPoint QVar9;
  long in_FS_OFFSET;
  QPointF QVar10;
  QPointF local_40;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QWidget::mousePressEvent(&this->super_QWidget,mouseEvent);
      return;
    }
  }
  else {
    if (this_00->isInInteractiveMode == true) {
      QMdiSubWindowPrivate::leaveInteractiveMode(this_00);
    }
    if (this_00->isInRubberBandMode == true) {
      QMdiSubWindowPrivate::leaveRubberBandMode(this_00);
    }
    if (*(int *)(mouseEvent + 0x40) == 1) {
      if (this_00->currentOperation == None) {
        this_00->activeSubControl = this_00->hoveredSubControl;
        if (this_00->hoveredSubControl == SC_ComboBoxFrame) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            showSystemMenu(this);
            return;
          }
          goto LAB_0041c0af;
        }
        pQVar4 = (this->super_QWidget).data;
        iVar2 = (pQVar4->crect).x2.m_i;
        iVar3 = (pQVar4->crect).x1.m_i;
        iVar8 = QMdiSubWindowPrivate::titleBarHeight(this_00);
        QRegion::QRegion((QRegion *)&local_40,0,0,(iVar2 - iVar3) + 1,iVar8,Rectangle);
        QWidget::update(&this->super_QWidget,(QRegion *)&local_40);
        QRegion::~QRegion((QRegion *)&local_40);
      }
      else {
        QMdiSubWindowPrivate::updateCursor(this_00);
        QVar10 = QSinglePointEvent::position((QSinglePointEvent *)mouseEvent);
        local_40.yp = QVar10.yp;
        local_40.xp = QVar10.xp;
        local_30 = QPointF::toPoint(&local_40);
        QVar9 = QWidget::mapToParent(&this->super_QWidget,&local_30);
        this_00->mousePressPosition = QVar9;
        if ((this_00->resizeEnabled != false) || (this_00->moveEnabled == true)) {
          pQVar4 = (this->super_QWidget).data;
          RVar5.m_i = (pQVar4->crect).y1.m_i;
          RVar6.m_i = (pQVar4->crect).x2.m_i;
          RVar7.m_i = (pQVar4->crect).y2.m_i;
          (this_00->oldGeometry).x1 = (Representation)(pQVar4->crect).x1.m_i;
          (this_00->oldGeometry).y1 = (Representation)RVar5.m_i;
          (this_00->oldGeometry).x2 = (Representation)RVar6.m_i;
          (this_00->oldGeometry).y2 = (Representation)RVar7.m_i;
        }
        uVar1 = *(uint *)(*(long *)&(this->super_QWidget).field_0x8 + 0x388);
        if ((((uVar1 & 4) != 0) && (Move < this_00->currentOperation)) ||
           (((uVar1 & 8) != 0 && (this_00->currentOperation == Move)))) {
          QMdiSubWindowPrivate::enterRubberBandMode(this_00);
        }
      }
    }
    else {
      mouseEvent[0xc] = (QMouseEvent)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
LAB_0041c0af:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mousePressEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mousePressEvent(mouseEvent);
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->isInInteractiveMode)
        d->leaveInteractiveMode();
#if QT_CONFIG(rubberband)
    if (d->isInRubberBandMode)
        d->leaveRubberBandMode();
#endif

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    if (d->currentOperation != QMdiSubWindowPrivate::None) {
        d->updateCursor();
        d->mousePressPosition = mapToParent(mouseEvent->position().toPoint());
        if (d->resizeEnabled || d->moveEnabled)
            d->oldGeometry = geometry();
#if QT_CONFIG(rubberband)
        if ((testOption(QMdiSubWindow::RubberBandResize) && d->isResizeOperation())
            || (testOption(QMdiSubWindow::RubberBandMove) && d->isMoveOperation())) {
            d->enterRubberBandMode();
        }
#endif
        return;
    }

    d->activeSubControl = d->hoveredSubControl;
#if QT_CONFIG(menu)
    if (d->activeSubControl == QStyle::SC_TitleBarSysMenu)
        showSystemMenu();
    else
#endif
    update(QRegion(0, 0, width(), d->titleBarHeight()));
}